

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

BayesianGameBase * __thiscall
BayesianGameBase::operator=(BayesianGameBase *this,BayesianGameBase *o)

{
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_00;
  size_t *psVar1;
  BayesianGameBase *in_RSI;
  BayesianGameBase *in_RDI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_00000008;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  Interface_ProblemToPolicyDiscretePure *in_stack_ffffffffffffffc0;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_stack_ffffffffffffffc8;
  BayesianGameBase *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    Interface_ProblemToPolicyDiscretePure::operator=
              (in_stack_ffffffffffffffc0,
               (Interface_ProblemToPolicyDiscretePure *)in_stack_ffffffffffffffb8);
    in_RDI->_m_useSparse = (bool)(in_RSI->_m_useSparse & 1);
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::operator=((mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
                 *)in_RDI,in_stack_ffffffffffffffc8);
    if (in_RSI->_m_jointToIndTypes ==
        (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)0x0) {
      in_RDI->_m_jointToIndTypes =
           (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 =
           (mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
            *)operator_new(0x18);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(in_stack_00000010,in_stack_00000008);
      in_RDI->_m_jointToIndTypes =
           (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_ffffffffffffffc8;
    }
    if (in_RSI->_m_jointToIndTypesMap ==
        (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         *)0x0) {
      in_RDI->_m_jointToIndTypesMap =
           (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            *)0x0;
    }
    else {
      this_00 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)operator_new(0x30);
      std::
      map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::map(this_00,in_stack_ffffffffffffffb8);
      in_RDI->_m_jointToIndTypesMap = this_00;
    }
    in_RDI->_m_initialized = (bool)(in_RSI->_m_initialized & 1);
    in_RDI->_m_verboseness = in_RSI->_m_verboseness;
    in_RDI->_m_nrAgents = in_RSI->_m_nrAgents;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000060,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000058);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000060,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000058);
    in_RDI->_m_nrJTypes = in_RSI->_m_nrJTypes;
    in_RDI->_m_nrJA = in_RSI->_m_nrJA;
    psVar1 = IndexTools::CalculateStepSize
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffffc8);
    in_RDI->_m_stepSizeTypes = psVar1;
    psVar1 = IndexTools::CalculateStepSize
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffffc8);
    in_RDI->_m_stepSizeActions = psVar1;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

BayesianGameBase& BayesianGameBase::operator= (const BayesianGameBase& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment

    Interface_ProblemToPolicyDiscretePure::operator=(o);

    _m_useSparse=o._m_useSparse;
    _m_jTypeProbs=o._m_jTypeProbs;
    _m_jTypeProbsSparse=o._m_jTypeProbsSparse;

    if(o._m_jointToIndTypes)
        _m_jointToIndTypes=new vector<vector<Index> >(*o._m_jointToIndTypes);
    else
        _m_jointToIndTypes=0;
    if(o._m_jointToIndTypesMap)
        _m_jointToIndTypesMap=new map<Index, vector<Index> >(*o._m_jointToIndTypesMap);
    else
        _m_jointToIndTypesMap=0;

    _m_initialized=o._m_initialized;
    _m_verboseness=o._m_verboseness;
    _m_nrAgents=o._m_nrAgents;
    _m_nrActions=o._m_nrActions;
    _m_nrTypes=o._m_nrTypes;
    _m_nrJTypes=o._m_nrJTypes;
    _m_nrJA=o._m_nrJA;
    _m_stepSizeTypes = IndexTools::CalculateStepSize(_m_nrTypes);
    _m_stepSizeActions = IndexTools::CalculateStepSize(_m_nrActions);
    
    return *this;
}